

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::TriangleMesh::getBounds(box3f *__return_storage_ptr__,TriangleMesh *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  pointer pvVar4;
  uint uVar5;
  undefined8 *in_RCX;
  pointer pvVar6;
  TriangleMesh *pTVar7;
  box3f *pbVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [16];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [16];
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  
  if (this->haveComputedBounds == false) {
    pTVar7 = this;
    uVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (uVar5 != 0) {
      pbVar8 = (box3f *)(ulong)uVar5;
      std::__throw_system_error(uVar5);
      fVar9 = *(float *)&(pTVar7->vertex).
                         super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      fVar11 = *(float *)(in_RCX + 1);
      uVar2 = *(undefined8 *)
               ((long)&(pTVar7->vertex).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
      fVar10 = *(float *)((long)in_RCX + 0x14);
      fVar37 = *(float *)(in_RCX + 4);
      fVar27 = (float)uVar2;
      fVar30 = (float)((ulong)uVar2 >> 0x20);
      fVar35 = fVar30 * fVar37 + fVar9 * fVar11 + fVar27 * fVar10;
      fVar12 = *(float *)((long)&(pTVar7->vertex).
                                 super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
      pvVar6 = (pTVar7->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      fVar14 = SUB84(pvVar6,0);
      fVar20 = (float)((ulong)pvVar6 >> 0x20);
      fVar45 = fVar37 * fVar20 + fVar11 * fVar12 + fVar10 * fVar14;
      fVar13 = *(float *)&(pTVar7->normal).
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      uVar2 = *(undefined8 *)
               ((long)&(pTVar7->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
      fVar21 = (float)uVar2;
      fVar22 = (float)((ulong)uVar2 >> 0x20);
      fVar42 = fVar37 * fVar22 + fVar11 * fVar13 + fVar10 * fVar21;
      uVar2 = *(undefined8 *)
               ((long)&(pTVar7->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4);
      fVar40 = (float)uVar2;
      fVar17 = (float)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)
               ((long)&(pTVar7->normal).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      fVar33 = (float)*in_RCX;
      fVar34 = (float)((ulong)*in_RCX >> 0x20);
      fVar38 = (float)*(undefined8 *)((long)in_RCX + 0xc);
      fVar18 = (float)((ulong)*(undefined8 *)((long)in_RCX + 0xc) >> 0x20);
      fVar39 = (float)in_RCX[3];
      fVar19 = (float)((ulong)in_RCX[3] >> 0x20);
      fVar61 = fVar30 * fVar39 + fVar27 * fVar38 + fVar9 * fVar33;
      fVar63 = fVar30 * fVar19 + fVar27 * fVar18 + fVar9 * fVar34;
      fVar64 = fVar30 * 0.0 + fVar27 * 0.0 + fVar9 * 0.0;
      fVar65 = fVar30 * 0.0 + fVar27 * 0.0 + fVar9 * 0.0;
      fVar27 = (float)uVar2;
      fVar30 = (float)((ulong)uVar2 >> 0x20);
      fVar46 = fVar20 * fVar39 + fVar14 * fVar38 + fVar12 * fVar33;
      fVar48 = fVar20 * fVar19 + fVar14 * fVar18 + fVar12 * fVar34;
      fVar49 = fVar20 * 0.0 + fVar14 * 0.0 + fVar12 * 0.0;
      fVar50 = fVar20 * 0.0 + fVar14 * 0.0 + fVar12 * 0.0;
      fVar9 = -fVar30;
      fVar36 = fVar35 * fVar9;
      fVar51 = fVar22 * fVar39 + fVar21 * fVar38 + fVar13 * fVar33;
      fVar53 = fVar22 * fVar19 + fVar21 * fVar18 + fVar13 * fVar34;
      fVar54 = fVar22 * 0.0 + fVar21 * 0.0 + fVar13 * 0.0;
      fVar55 = fVar22 * 0.0 + fVar21 * 0.0 + fVar13 * 0.0;
      fVar43 = fVar42 * fVar30;
      fVar66 = fVar30 * fVar51;
      fVar67 = fVar30 * fVar53;
      fVar68 = fVar30 * fVar54;
      fVar69 = fVar30 * fVar55;
      fVar51 = fVar51 * fVar9;
      fVar53 = fVar53 * fVar9;
      fVar54 = fVar54 * fVar9;
      fVar55 = fVar55 * fVar9;
      fVar12 = fVar30 * fVar46;
      fVar20 = fVar30 * fVar48;
      fVar21 = fVar30 * fVar49;
      fVar22 = fVar30 * fVar50;
      fVar46 = fVar46 * fVar9;
      fVar48 = fVar48 * fVar9;
      fVar49 = fVar49 * fVar9;
      fVar50 = fVar50 * fVar9;
      fVar56 = fVar9 * fVar61;
      fVar58 = fVar9 * fVar63;
      fVar59 = fVar9 * fVar64;
      fVar60 = fVar9 * fVar65;
      fVar61 = fVar61 * fVar30;
      fVar63 = fVar63 * fVar30;
      fVar64 = fVar64 * fVar30;
      fVar65 = fVar65 * fVar30;
      fVar13 = fVar30 * fVar45;
      fVar45 = fVar45 * fVar9;
      fVar42 = fVar42 * fVar9;
      fVar14 = fVar13 + fVar36;
      fVar36 = fVar36 + fVar45;
      fVar35 = fVar35 * fVar30;
      fVar13 = fVar13 + fVar35;
      fVar9 = *(float *)((long)in_RCX + 0x2c) + fVar10 * fVar17 + fVar11 * fVar40 + fVar37 * fVar27;
      fVar10 = fVar36 + fVar42 + fVar9;
      fVar11 = fVar10;
      if (3.4028235e+38 <= fVar10) {
        fVar11 = 3.4028235e+38;
      }
      fVar37 = fVar36 + fVar43 + fVar9;
      fVar30 = fVar37;
      if (fVar11 <= fVar37) {
        fVar30 = fVar11;
      }
      if (fVar10 <= -3.4028235e+38) {
        fVar10 = -3.4028235e+38;
      }
      if (fVar37 <= fVar10) {
        fVar37 = fVar10;
      }
      fVar11 = fVar14 + fVar42 + fVar9;
      fVar10 = fVar11;
      if (fVar30 <= fVar11) {
        fVar10 = fVar30;
      }
      if (fVar11 <= fVar37) {
        fVar11 = fVar37;
      }
      fVar37 = fVar14 + fVar43 + fVar9;
      fVar14 = fVar37;
      if (fVar10 <= fVar37) {
        fVar14 = fVar10;
      }
      if (fVar37 <= fVar11) {
        fVar37 = fVar11;
      }
      fVar35 = fVar35 + fVar45;
      fVar10 = fVar42 + fVar35 + fVar9;
      fVar11 = fVar10;
      if (fVar14 <= fVar10) {
        fVar11 = fVar14;
      }
      if (fVar10 <= fVar37) {
        fVar10 = fVar37;
      }
      fVar37 = fVar35 + fVar43 + fVar9;
      fVar14 = fVar37;
      if (fVar11 <= fVar37) {
        fVar14 = fVar11;
      }
      if (fVar37 <= fVar10) {
        fVar37 = fVar10;
      }
      fVar10 = fVar42 + fVar13 + fVar9;
      fVar11 = fVar10;
      if (fVar14 <= fVar10) {
        fVar11 = fVar14;
      }
      if (fVar10 <= fVar37) {
        fVar10 = fVar37;
      }
      fVar9 = fVar13 + fVar43 + fVar9;
      fVar38 = (float)*(undefined8 *)((long)in_RCX + 0x24) +
               fVar27 * fVar39 + fVar17 * fVar38 + fVar40 * fVar33;
      fVar39 = (float)((ulong)*(undefined8 *)((long)in_RCX + 0x24) >> 0x20) +
               fVar27 * fVar19 + fVar17 * fVar18 + fVar40 * fVar34;
      fVar14 = fVar27 * 0.0 + fVar17 * 0.0 + fVar40 * 0.0 + 0.0;
      fVar40 = fVar27 * 0.0 + fVar17 * 0.0 + fVar40 * 0.0 + 0.0;
      fVar37 = fVar56 + fVar46;
      fVar13 = fVar58 + fVar48;
      fVar33 = fVar59 + fVar49;
      fVar34 = fVar60 + fVar50;
      auVar15._0_8_ = CONCAT44(fVar13 + fVar53 + fVar39,fVar37 + fVar51 + fVar38);
      auVar15._8_4_ = fVar33 + fVar54 + fVar14;
      auVar15._12_4_ = fVar34 + fVar55 + fVar40;
      auVar32._8_4_ = auVar15._8_4_;
      auVar32._0_8_ = auVar15._0_8_;
      auVar32._12_4_ = auVar15._12_4_;
      auVar23 = minps(auVar32,_DAT_0014a270);
      auVar31._0_8_ = CONCAT44(fVar13 + fVar67 + fVar39,fVar37 + fVar66 + fVar38);
      auVar31._8_4_ = fVar33 + fVar68 + fVar14;
      auVar31._12_4_ = fVar34 + fVar69 + fVar40;
      auVar28._8_4_ = auVar31._8_4_;
      auVar28._0_8_ = auVar31._0_8_;
      auVar28._12_4_ = auVar31._12_4_;
      auVar29 = minps(auVar28,auVar23);
      auVar15 = maxps(auVar15,_DAT_0014a280);
      auVar32 = maxps(auVar31,auVar15);
      fVar56 = fVar56 + fVar12;
      fVar58 = fVar58 + fVar20;
      fVar59 = fVar59 + fVar21;
      fVar60 = fVar60 + fVar22;
      auVar41._0_8_ = CONCAT44(fVar58 + fVar53 + fVar39,fVar56 + fVar51 + fVar38);
      auVar41._8_4_ = fVar59 + fVar54 + fVar14;
      auVar41._12_4_ = fVar60 + fVar55 + fVar40;
      auVar23._8_4_ = auVar41._8_4_;
      auVar23._0_8_ = auVar41._0_8_;
      auVar23._12_4_ = auVar41._12_4_;
      auVar15 = minps(auVar23,auVar29);
      auVar57._0_8_ = CONCAT44(fVar58 + fVar67 + fVar39,fVar56 + fVar66 + fVar38);
      auVar57._8_4_ = fVar59 + fVar68 + fVar14;
      auVar57._12_4_ = fVar60 + fVar69 + fVar40;
      auVar24._8_4_ = auVar57._8_4_;
      auVar24._0_8_ = auVar57._0_8_;
      auVar24._12_4_ = auVar57._12_4_;
      auVar15 = minps(auVar24,auVar15);
      fVar46 = fVar46 + fVar61;
      fVar48 = fVar48 + fVar63;
      fVar49 = fVar49 + fVar64;
      fVar50 = fVar50 + fVar65;
      auVar44._0_8_ = CONCAT44(fVar48 + fVar53 + fVar39,fVar46 + fVar51 + fVar38);
      auVar44._8_4_ = fVar49 + fVar54 + fVar14;
      auVar44._12_4_ = fVar50 + fVar55 + fVar40;
      auVar29._8_4_ = auVar44._8_4_;
      auVar29._0_8_ = auVar44._0_8_;
      auVar29._12_4_ = auVar44._12_4_;
      auVar15 = minps(auVar29,auVar15);
      auVar47._0_8_ = CONCAT44(fVar48 + fVar67 + fVar39,fVar46 + fVar66 + fVar38);
      auVar47._8_4_ = fVar49 + fVar68 + fVar14;
      auVar47._12_4_ = fVar50 + fVar69 + fVar40;
      auVar25._8_4_ = auVar47._8_4_;
      auVar25._0_8_ = auVar47._0_8_;
      auVar25._12_4_ = auVar47._12_4_;
      auVar15 = minps(auVar25,auVar15);
      fVar61 = fVar61 + fVar12;
      fVar63 = fVar63 + fVar20;
      fVar64 = fVar64 + fVar21;
      fVar65 = fVar65 + fVar22;
      auVar52._0_8_ = CONCAT44(fVar53 + fVar63 + fVar39,fVar51 + fVar61 + fVar38);
      auVar52._8_4_ = fVar54 + fVar64 + fVar14;
      auVar52._12_4_ = fVar55 + fVar65 + fVar40;
      auVar16._8_4_ = auVar52._8_4_;
      auVar16._0_8_ = auVar52._0_8_;
      auVar16._12_4_ = auVar52._12_4_;
      auVar15 = minps(auVar16,auVar15);
      auVar62._0_8_ = CONCAT44(fVar63 + fVar67 + fVar39,fVar61 + fVar66 + fVar38);
      auVar62._8_4_ = fVar64 + fVar68 + fVar14;
      auVar62._12_4_ = fVar65 + fVar69 + fVar40;
      auVar26._8_4_ = auVar62._8_4_;
      auVar26._0_8_ = auVar62._0_8_;
      auVar26._12_4_ = auVar62._12_4_;
      auVar15 = minps(auVar26,auVar15);
      fVar37 = fVar9;
      if (fVar11 <= fVar9) {
        fVar37 = fVar11;
      }
      (pbVar8->lower).x = (float)(int)auVar15._0_8_;
      (pbVar8->lower).y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
      (pbVar8->lower).z = fVar37;
      auVar15 = maxps(auVar41,auVar32);
      auVar15 = maxps(auVar57,auVar15);
      auVar15 = maxps(auVar44,auVar15);
      auVar15 = maxps(auVar47,auVar15);
      auVar15 = maxps(auVar52,auVar15);
      auVar15 = maxps(auVar62,auVar15);
      if (fVar9 <= fVar10) {
        fVar9 = fVar10;
      }
      (pbVar8->upper).x = (float)(int)auVar15._0_8_;
      (pbVar8->upper).y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
      (pbVar8->upper).z = fVar9;
      return pbVar8;
    }
    if (this->haveComputedBounds == false) {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      pvVar6 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pvVar6 != pvVar4) {
        fVar11 = -3.4028235e+38;
        fVar10 = -3.4028235e+38;
        fVar37 = 3.4028235e+38;
        fVar12 = 3.4028235e+38;
        fVar9 = -3.4028235e+38;
        fVar13 = 3.4028235e+38;
        do {
          fVar33 = pvVar6->z;
          fVar34 = fVar33;
          if (fVar13 <= fVar33) {
            fVar34 = fVar13;
          }
          uVar1 = pvVar6->x;
          uVar3 = pvVar6->y;
          fVar11 = (float)(~-(uint)(fVar11 < (float)uVar1) & (uint)fVar11 |
                          uVar1 & -(uint)(fVar11 < (float)uVar1));
          fVar10 = (float)(~-(uint)(fVar10 < (float)uVar3) & (uint)fVar10 |
                          uVar3 & -(uint)(fVar10 < (float)uVar3));
          fVar37 = (float)(~-(uint)((float)uVar1 < fVar37) & (uint)fVar37 |
                          uVar1 & -(uint)((float)uVar1 < fVar37));
          fVar12 = (float)(~-(uint)((float)uVar3 < fVar12) & (uint)fVar12 |
                          uVar3 & -(uint)((float)uVar3 < fVar12));
          (this->bounds).lower.z = fVar37;
          (this->bounds).upper.x = fVar12;
          (this->bounds).lower.z = fVar34;
          if (fVar33 <= fVar9) {
            fVar33 = fVar9;
          }
          fVar9 = fVar33;
          (this->bounds).upper.x = fVar11;
          (this->bounds).upper.y = fVar10;
          (this->bounds).upper.z = fVar9;
          pvVar6 = pvVar6 + 1;
          fVar13 = fVar34;
        } while (pvVar6 != pvVar4);
      }
      this->haveComputedBounds = true;
    }
    fVar9 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar9;
    fVar9 = (this->bounds).lower.y;
    uVar2 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar9;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar2;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  else {
    fVar9 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar9;
    fVar9 = (this->bounds).lower.y;
    uVar2 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar9;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) {
        bounds.extend(v);
      }
      
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }